

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyImageToBuffer::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  Allocator *pAVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  long lVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *pUVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Operation *pOVar13;
  TextureFormat TVar14;
  Buffer *pBVar15;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *pUVar16;
  Image *this_00;
  ulong uVar17;
  _func_int *p_Var18;
  _func_int **bufferSize;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  local_a8;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
  *local_98;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_90;
  VkImageCreateInfo local_88;
  
  local_90 = __return_storage_ptr__;
  if (this->m_mode == ACCESS_MODE_READ) {
    pOVar13 = (Operation *)operator_new(0x30);
    pOVar13->_vptr_Operation = (_func_int **)&PTR__ReadImplementation_00d01e20;
    pOVar13[1]._vptr_Operation = (_func_int **)context;
    pOVar13[2]._vptr_Operation = (_func_int **)resource;
    pOVar13[3]._vptr_Operation = (_func_int **)0x0;
    pUVar16 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar13 + 3);
    TVar14 = ::vk::mapVkFormat((resource->m_imageData).format);
    iVar12 = tcu::getPixelSize(TVar14);
    bufferSize = (_func_int **)
                 (ulong)(iVar12 * (resource->m_imageData).extent.width *
                         (resource->m_imageData).extent.height *
                        (resource->m_imageData).extent.depth);
    pOVar13[5]._vptr_Operation = bufferSize;
    pp_Var4 = pOVar13[1]._vptr_Operation;
    pDVar1 = (DeviceInterface *)pp_Var4[1];
    pVVar2 = (VkDevice)pp_Var4[3];
    pAVar3 = (Allocator *)pp_Var4[4];
    pBVar15 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,(VkDeviceSize)bufferSize,2);
    synchronization::Buffer::Buffer
              (pBVar15,pDVar1,pVVar2,pAVar3,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_a8.m_data.ptr = (Buffer *)0x0;
    if ((pUVar16->m_data).ptr != pBVar15) {
      de::details::
      UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
      reset(pUVar16);
      (pUVar16->m_data).ptr = pBVar15;
    }
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(&local_a8);
    p_Var5 = pOVar13[3]._vptr_Operation[4];
    memset(*(void **)(p_Var5 + 0x18),0,(size_t)pOVar13[5]._vptr_Operation);
    ::vk::flushMappedMemoryRange
              (pDVar1,pVVar2,(VkDeviceMemory)*(deUint64 *)(p_Var5 + 8),
               *(VkDeviceSize *)(p_Var5 + 0x10),(VkDeviceSize)pOVar13[5]._vptr_Operation);
  }
  else {
    pOVar13 = (Operation *)operator_new(0x70);
    pOVar13->_vptr_Operation = (_func_int **)&PTR__WriteImplementation_00d01e70;
    pOVar13[1]._vptr_Operation = (_func_int **)context;
    pOVar13[2]._vptr_Operation = (_func_int **)resource;
    pOVar13[3]._vptr_Operation = (_func_int **)0x1;
    pOVar13[4]._vptr_Operation = (_func_int **)0x1;
    *(undefined4 *)&pOVar13[5]._vptr_Operation = 1;
    *(undefined8 *)((long)&pOVar13[5]._vptr_Operation + 4) = 1;
    *(undefined8 *)((long)&pOVar13[6]._vptr_Operation + 4) = 0x100000000;
    pUVar16 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar13 + 8);
    pOVar13[8]._vptr_Operation = (_func_int **)0x0;
    local_98 = (UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                *)(pOVar13 + 10);
    pOVar13[10]._vptr_Operation = (_func_int **)0x0;
    pDVar1 = context->m_vk;
    pVVar2 = context->m_device;
    pAVar3 = context->m_allocator;
    TVar14 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    uVar10 = tcu::getPixelSize(TVar14);
    pp_Var4 = pOVar13[2]._vptr_Operation;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pp_Var4[5];
    uVar11 = SUB164(auVar7 / ZEXT416(uVar10),0);
    uVar8 = 0x1000;
    if (uVar11 < 0x1000) {
      uVar8 = uVar11;
    }
    pOVar13[0xc]._vptr_Operation =
         (_func_int **)
         CONCAT44(((uVar11 >> 0xc) + 1) -
                  (uint)((auVar7 / ZEXT416(uVar10) & (undefined1  [16])0xfff) ==
                        (undefined1  [16])0x0),uVar8);
    *(undefined4 *)&pOVar13[0xd]._vptr_Operation = 1;
    pBVar15 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,(VkDeviceSize)pp_Var4[5],1);
    synchronization::Buffer::Buffer
              (pBVar15,pDVar1,pVVar2,pAVar3,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_a8.m_data.ptr = (Buffer *)0x0;
    if ((pUVar16->m_data).ptr != pBVar15) {
      de::details::
      UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
      reset(pUVar16);
      (pUVar16->m_data).ptr = pBVar15;
    }
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(&local_a8);
    p_Var5 = pOVar13[8]._vptr_Operation[4];
    p_Var18 = pOVar13[2]._vptr_Operation[5];
    if (p_Var18 == (_func_int *)0x0) {
      p_Var18 = (_func_int *)0x0;
    }
    else {
      lVar6 = *(long *)(p_Var5 + 0x18);
      uVar17 = 0;
      do {
        *(undefined1 *)(lVar6 + uVar17) =
             (&synchronization::(anonymous_namespace)::fillPattern(void*,unsigned_long)::pattern)
             [uVar17 % 0xb];
        uVar17 = uVar17 + 1;
      } while ((_func_int *)(uVar17 & 0xffffffff) < p_Var18);
      p_Var18 = pOVar13[2]._vptr_Operation[5];
    }
    ::vk::flushMappedMemoryRange
              (pDVar1,pVVar2,(VkDeviceMemory)*(deUint64 *)(p_Var5 + 8),
               *(VkDeviceSize *)(p_Var5 + 0x10),(VkDeviceSize)p_Var18);
    this_00 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,VK_IMAGE_TYPE_2D,(VkExtent3D *)(pOVar13 + 0xc),
                        VK_FORMAT_R8G8B8A8_UNORM,3);
    synchronization::Image::Image(this_00,pDVar1,pVVar2,pAVar3,&local_88,(MemoryRequirement)0x0);
    pUVar9 = local_98;
    local_a8.m_data.ptr = (Buffer *)0x0;
    if ((local_98->m_data).ptr != this_00) {
      de::details::
      UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
      reset(local_98);
      (pUVar9->m_data).ptr = this_00;
    }
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
              ((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                *)&local_a8);
  }
  (local_90->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar13;
  return local_90;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_mode == ACCESS_MODE_READ)
			return de::MovePtr<Operation>(new ReadImplementation(context, resource));
		else
			return de::MovePtr<Operation>(new WriteImplementation(context, resource));
	}